

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O0

int lws_hdr_copy(lws *wsi,char *dst,int len,lws_token_indexes h)

{
  uint uVar1;
  char *pcVar2;
  uint local_30;
  int comma;
  int n;
  int toklen;
  lws_token_indexes h_local;
  int len_local;
  char *dst_local;
  lws *wsi_local;
  
  wsi_local._4_4_ = lws_hdr_total_length(wsi,h);
  *dst = '\0';
  if (wsi_local._4_4_ == 0) {
    wsi_local._4_4_ = 0;
  }
  else if (wsi_local._4_4_ < len) {
    if ((wsi->http).ah == (allocated_headers *)0x0) {
      wsi_local._4_4_ = -1;
    }
    else {
      local_30 = (uint)((wsi->http).ah)->frag_index[h];
      toklen = len;
      _h_local = dst;
      if (local_30 == 0) {
        wsi_local._4_4_ = 0;
      }
      else {
        do {
          uVar1 = (uint)(((wsi->http).ah)->frags[(int)local_30].nfrag != '\0' &&
                        h != WSI_TOKEN_HTTP_COOKIE);
          if (toklen <= (int)(((wsi->http).ah)->frags[(int)local_30].len + uVar1)) {
            return -1;
          }
          strncpy(_h_local,((wsi->http).ah)->data + ((wsi->http).ah)->frags[(int)local_30].offset,
                  (ulong)((wsi->http).ah)->frags[(int)local_30].len);
          pcVar2 = _h_local + (int)(uint)((wsi->http).ah)->frags[(int)local_30].len;
          toklen = toklen - (uint)((wsi->http).ah)->frags[(int)local_30].len;
          local_30 = (uint)((wsi->http).ah)->frags[(int)local_30].nfrag;
          _h_local = pcVar2;
          if (uVar1 != 0) {
            _h_local = pcVar2 + 1;
            *pcVar2 = ',';
          }
        } while (local_30 != 0);
        *_h_local = '\0';
      }
    }
  }
  else {
    wsi_local._4_4_ = -1;
  }
  return wsi_local._4_4_;
}

Assistant:

int lws_hdr_copy(struct lws *wsi, char *dst, int len,
			     enum lws_token_indexes h)
{
	int toklen = lws_hdr_total_length(wsi, h);
	int n;
	int comma;

	*dst = '\0';
	if (!toklen)
		return 0;

	if (toklen >= len)
		return -1;

	if (!wsi->http.ah)
		return -1;

	n = wsi->http.ah->frag_index[h];
	if (!n)
		return 0;

	do {
		comma = (wsi->http.ah->frags[n].nfrag &&
			h != WSI_TOKEN_HTTP_COOKIE) ? 1 : 0;

		if (wsi->http.ah->frags[n].len + comma >= len)
			return -1;
		strncpy(dst, &wsi->http.ah->data[wsi->http.ah->frags[n].offset],
		        wsi->http.ah->frags[n].len);
		dst += wsi->http.ah->frags[n].len;
		len -= wsi->http.ah->frags[n].len;
		n = wsi->http.ah->frags[n].nfrag;

		if (comma)
			*dst++ = ',';
				
	} while (n);
	*dst = '\0';

	return toklen;
}